

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int accessPayload(BtCursor *pCur,u32 offset,u32 amt,uchar *pBuf,int eOp)

{
  ushort uVar1;
  ushort uVar2;
  MemPage *pPage;
  u8 *puVar3;
  int iVar4;
  Pgno *pPVar5;
  long lVar6;
  undefined8 uVar7;
  u32 uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uchar *__src;
  uchar *__dest;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uchar *puVar15;
  int iVar16;
  Pgno nextPage;
  DbPage *pDbPage;
  uint local_6c;
  uchar *local_68;
  int local_60;
  uint local_5c;
  ulong local_58;
  BtShared *local_50;
  int local_44;
  DbPage *local_40;
  DbPage *local_38;
  
  uVar12 = (ulong)amt;
  pPage = pCur->apPage[pCur->iPage];
  local_50 = pCur->pBt;
  local_60 = eOp;
  if ((pCur->info).nSize == 0) {
    btreeParseCellPtr(pPage,pPage->aData +
                            (CONCAT11(pPage->aCellIdx[(ulong)pCur->aiIdx[pCur->iPage] * 2],
                                      pPage->aCellIdx[(ulong)pCur->aiIdx[pCur->iPage] * 2 + 1]) &
                            pPage->maskPage),&pCur->info);
    pCur->validNKey = '\x01';
  }
  iVar4 = 0;
  if (pPage->intKey == '\0') {
    iVar4 = (int)(pCur->info).nKey;
  }
  uVar7 = 0xd11c;
  if (iVar4 + (pCur->info).nData < amt + offset) goto LAB_001604ee;
  uVar1 = (pCur->info).nHeader;
  puVar3 = (pCur->info).pCell;
  uVar2 = (pCur->info).nLocal;
  local_68 = pBuf;
  if (pPage->aData + local_50->usableSize < puVar3 + (ulong)uVar2 + (ulong)uVar1) goto LAB_001604ee;
  uVar10 = (uint)uVar2;
  if (uVar10 < offset || uVar10 - offset == 0) {
    uVar14 = (ulong)(offset - uVar10);
    iVar4 = 0;
  }
  else {
    uVar8 = uVar10 - offset;
    if (amt + offset <= (uint)uVar2) {
      uVar8 = amt;
    }
    local_58 = uVar12;
    if (local_60 == 0) {
      memcpy(pBuf,puVar3 + (ulong)offset + (ulong)uVar1,(long)(int)uVar8);
LAB_001602b8:
      iVar4 = 0;
    }
    else {
      iVar4 = sqlite3PagerWrite(pPage->pDbPage);
      pBuf = local_68;
      if (iVar4 == 0) {
        memcpy(puVar3 + (ulong)offset + (ulong)uVar1,local_68,(long)(int)uVar8);
        goto LAB_001602b8;
      }
    }
    local_68 = pBuf + (int)uVar8;
    uVar12 = (ulong)((int)local_58 - uVar8);
    uVar14 = 0;
  }
  if ((iVar4 == 0) && ((int)uVar12 != 0)) {
    local_5c = local_50->usableSize - 4;
    uVar11 = (ulong)local_5c;
    uVar2 = (pCur->info).nLocal;
    uVar10 = *(uint *)(puVar3 + (ulong)uVar2 + (ulong)uVar1);
    uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
    pPVar5 = pCur->aOverflow;
    local_6c = uVar10;
    if (pCur->isIncrblobHandle == '\0') {
      iVar4 = 0;
LAB_0016037f:
      if (pPVar5 != (Pgno *)0x0) goto LAB_00160388;
      lVar6 = 0;
    }
    else {
      if (pPVar5 == (Pgno *)0x0) {
        uVar9 = ((local_50->usableSize - (uint)uVar2) + (pCur->info).nPayload) - 5;
        iVar4 = uVar9 / local_5c << 2;
        local_58 = uVar12;
        pPVar5 = (Pgno *)sqlite3Malloc(iVar4);
        if (pPVar5 != (Pgno *)0x0) {
          memset(pPVar5,0,(long)iVar4);
        }
        uVar11 = (ulong)local_5c;
        iVar4 = 7;
        if (uVar9 < local_5c) {
          iVar4 = 0;
        }
        pCur->aOverflow = pPVar5;
        uVar12 = local_58;
        if (pPVar5 != (Pgno *)0x0) {
          iVar4 = 0;
        }
        goto LAB_0016037f;
      }
      iVar4 = 0;
LAB_00160388:
      lVar6 = 0;
      if (pPVar5[uVar14 / uVar11] != 0) {
        lVar6 = (long)(int)(uVar14 / uVar11);
        uVar10 = pPVar5[lVar6];
        uVar14 = uVar14 % uVar11;
        local_6c = uVar10;
      }
    }
    if ((iVar4 == 0) && (uVar10 != 0)) {
      local_44 = (uint)(local_60 == 0) * 2;
      lVar6 = lVar6 * 4;
      do {
        pPVar5 = pCur->aOverflow;
        uVar9 = (uint)uVar11;
        uVar13 = (uint)uVar14;
        if (pPVar5 == (Pgno *)0x0) {
          if (uVar13 < uVar9) goto LAB_001603f7;
LAB_00160433:
          iVar4 = getOverflowPage(local_50,uVar10,(MemPage **)0x0,&local_6c);
          uVar11 = (ulong)local_5c;
LAB_00160457:
          uVar14 = (ulong)(uVar13 - (int)uVar11);
          uVar10 = local_6c;
        }
        else {
          *(uint *)((long)pPVar5 + lVar6) = uVar10;
          if (uVar9 <= uVar13) {
            uVar9 = *(uint *)((long)pPVar5 + lVar6 + 4);
            if (uVar9 == 0) goto LAB_00160433;
            iVar4 = 0;
            local_6c = uVar9;
            goto LAB_00160457;
          }
LAB_001603f7:
          iVar16 = uVar9 - uVar13;
          if ((int)uVar12 + uVar13 <= uVar9) {
            iVar16 = (int)uVar12;
          }
          local_58 = uVar12;
          iVar4 = sqlite3PagerAcquire(local_50->pPager,uVar10,&local_38,local_44);
          if (iVar4 == 0) {
            puVar15 = (uchar *)((ulong)(uVar13 + 4) + (long)local_38->pData);
            uVar10 = *local_38->pData;
            uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                     uVar10 << 0x18;
            local_40 = local_38;
            __src = puVar15;
            __dest = local_68;
            local_6c = uVar10;
            if ((local_60 == 0) ||
               (iVar4 = sqlite3PagerWrite(local_38), __src = local_68, __dest = puVar15, iVar4 == 0)
               ) {
              memcpy(__dest,__src,(long)iVar16);
              iVar4 = 0;
            }
            sqlite3PagerUnref(local_40);
            uVar14 = 0;
          }
          uVar12 = (ulong)(uint)((int)local_58 - iVar16);
          local_68 = local_68 + iVar16;
          uVar11 = (ulong)local_5c;
        }
      } while (((iVar4 == 0) && ((int)uVar12 != 0)) && (lVar6 = lVar6 + 4, uVar10 != 0));
    }
  }
  if (iVar4 != 0) {
    return iVar4;
  }
  uVar7 = 0xd1a4;
  if ((int)uVar12 == 0) {
    return 0;
  }
LAB_001604ee:
  sqlite3_log(0xb,"database corruption at line %d of [%.10s]",uVar7,
              "118a3b35693b134d56ebd780123b7fd6f1497668");
  return 0xb;
}

Assistant:

static int accessPayload(
  BtCursor *pCur,      /* Cursor pointing to entry to read from */
  u32 offset,          /* Begin reading this far into payload */
  u32 amt,             /* Read this many bytes */
  unsigned char *pBuf, /* Write the bytes into this buffer */ 
  int eOp              /* zero to read. non-zero to write. */
){
  unsigned char *aPayload;
  int rc = SQLITE_OK;
  u32 nKey;
  int iIdx = 0;
  MemPage *pPage = pCur->apPage[pCur->iPage]; /* Btree page of current entry */
  BtShared *pBt = pCur->pBt;                  /* Btree this cursor belongs to */

  assert( pPage );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->aiIdx[pCur->iPage]<pPage->nCell );
  assert( cursorHoldsMutex(pCur) );

  getCellInfo(pCur);
  aPayload = pCur->info.pCell + pCur->info.nHeader;
  nKey = (pPage->intKey ? 0 : (int)pCur->info.nKey);

  if( NEVER(offset+amt > nKey+pCur->info.nData) 
   || &aPayload[pCur->info.nLocal] > &pPage->aData[pBt->usableSize]
  ){
    /* Trying to read or write past the end of the data is an error */
    return SQLITE_CORRUPT_BKPT;
  }

  /* Check if data must be read/written to/from the btree page itself. */
  if( offset<pCur->info.nLocal ){
    int a = amt;
    if( a+offset>pCur->info.nLocal ){
      a = pCur->info.nLocal - offset;
    }
    rc = copyPayload(&aPayload[offset], pBuf, a, eOp, pPage->pDbPage);
    offset = 0;
    pBuf += a;
    amt -= a;
  }else{
    offset -= pCur->info.nLocal;
  }

  if( rc==SQLITE_OK && amt>0 ){
    const u32 ovflSize = pBt->usableSize - 4;  /* Bytes content per ovfl page */
    Pgno nextPage;

    nextPage = get4byte(&aPayload[pCur->info.nLocal]);

#ifndef SQLITE_OMIT_INCRBLOB
    /* If the isIncrblobHandle flag is set and the BtCursor.aOverflow[]
    ** has not been allocated, allocate it now. The array is sized at
    ** one entry for each overflow page in the overflow chain. The
    ** page number of the first overflow page is stored in aOverflow[0],
    ** etc. A value of 0 in the aOverflow[] array means "not yet known"
    ** (the cache is lazily populated).
    */
    if( pCur->isIncrblobHandle && !pCur->aOverflow ){
      int nOvfl = (pCur->info.nPayload-pCur->info.nLocal+ovflSize-1)/ovflSize;
      pCur->aOverflow = (Pgno *)sqlite3MallocZero(sizeof(Pgno)*nOvfl);
      /* nOvfl is always positive.  If it were zero, fetchPayload would have
      ** been used instead of this routine. */
      if( ALWAYS(nOvfl) && !pCur->aOverflow ){
        rc = SQLITE_NOMEM;
      }
    }

    /* If the overflow page-list cache has been allocated and the
    ** entry for the first required overflow page is valid, skip
    ** directly to it.
    */
    if( pCur->aOverflow && pCur->aOverflow[offset/ovflSize] ){
      iIdx = (offset/ovflSize);
      nextPage = pCur->aOverflow[iIdx];
      offset = (offset%ovflSize);
    }
#endif

    for( ; rc==SQLITE_OK && amt>0 && nextPage; iIdx++){

#ifndef SQLITE_OMIT_INCRBLOB
      /* If required, populate the overflow page-list cache. */
      if( pCur->aOverflow ){
        assert(!pCur->aOverflow[iIdx] || pCur->aOverflow[iIdx]==nextPage);
        pCur->aOverflow[iIdx] = nextPage;
      }
#endif

      if( offset>=ovflSize ){
        /* The only reason to read this page is to obtain the page
        ** number for the next page in the overflow chain. The page
        ** data is not required. So first try to lookup the overflow
        ** page-list cache, if any, then fall back to the getOverflowPage()
        ** function.
        */
#ifndef SQLITE_OMIT_INCRBLOB
        if( pCur->aOverflow && pCur->aOverflow[iIdx+1] ){
          nextPage = pCur->aOverflow[iIdx+1];
        } else 
#endif
          rc = getOverflowPage(pBt, nextPage, 0, &nextPage);
        offset -= ovflSize;
      }else{
        /* Need to read this page properly. It contains some of the
        ** range of data that is being read (eOp==0) or written (eOp!=0).
        */
#ifdef SQLITE_DIRECT_OVERFLOW_READ
        sqlite3_file *fd;
#endif
        int a = amt;
        if( a + offset > ovflSize ){
          a = ovflSize - offset;
        }

#ifdef SQLITE_DIRECT_OVERFLOW_READ
        /* If all the following are true:
        **
        **   1) this is a read operation, and 
        **   2) data is required from the start of this overflow page, and
        **   3) the database is file-backed, and
        **   4) there is no open write-transaction, and
        **   5) the database is not a WAL database,
        **
        ** then data can be read directly from the database file into the
        ** output buffer, bypassing the page-cache altogether. This speeds
        ** up loading large records that span many overflow pages.
        */
        if( eOp==0                                             /* (1) */
         && offset==0                                          /* (2) */
         && pBt->inTransaction==TRANS_READ                     /* (4) */
         && (fd = sqlite3PagerFile(pBt->pPager))->pMethods     /* (3) */
         && pBt->pPage1->aData[19]==0x01                       /* (5) */
        ){
          u8 aSave[4];
          u8 *aWrite = &pBuf[-4];
          memcpy(aSave, aWrite, 4);
          rc = sqlite3OsRead(fd, aWrite, a+4, (i64)pBt->pageSize*(nextPage-1));
          nextPage = get4byte(aWrite);
          memcpy(aWrite, aSave, 4);
        }else
#endif

        {
          DbPage *pDbPage;
          rc = sqlite3PagerAcquire(pBt->pPager, nextPage, &pDbPage,
              (eOp==0 ? PAGER_ACQUIRE_READONLY : 0)
          );
          if( rc==SQLITE_OK ){
            aPayload = sqlite3PagerGetData(pDbPage);
            nextPage = get4byte(aPayload);
            rc = copyPayload(&aPayload[offset+4], pBuf, a, eOp, pDbPage);
            sqlite3PagerUnref(pDbPage);
            offset = 0;
          }
        }
        amt -= a;
        pBuf += a;
      }
    }
  }

  if( rc==SQLITE_OK && amt>0 ){
    return SQLITE_CORRUPT_BKPT;
  }
  return rc;
}